

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

xmlChar * htmlParseAttribute(htmlParserCtxtPtr ctxt,xmlChar **value)

{
  xmlChar *local_30;
  xmlChar *val;
  xmlChar *name;
  xmlChar **value_local;
  htmlParserCtxtPtr ctxt_local;
  
  local_30 = (xmlChar *)0x0;
  *value = (xmlChar *)0x0;
  ctxt_local = (htmlParserCtxtPtr)htmlParseHTMLName(ctxt);
  if (ctxt_local == (htmlParserCtxtPtr)0x0) {
    htmlParseErr(ctxt,XML_ERR_NAME_REQUIRED,"error parsing attribute name\n",(xmlChar *)0x0,
                 (xmlChar *)0x0);
    ctxt_local = (htmlParserCtxtPtr)0x0;
  }
  else {
    htmlSkipBlankChars(ctxt);
    if (*ctxt->input->cur == '=') {
      xmlNextChar(ctxt);
      htmlSkipBlankChars(ctxt);
      local_30 = htmlParseAttValue(ctxt);
    }
    *value = local_30;
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

static const xmlChar *
htmlParseAttribute(htmlParserCtxtPtr ctxt, xmlChar **value) {
    const xmlChar *name;
    xmlChar *val = NULL;

    *value = NULL;
    name = htmlParseHTMLName(ctxt);
    if (name == NULL) {
	htmlParseErr(ctxt, XML_ERR_NAME_REQUIRED,
	             "error parsing attribute name\n", NULL, NULL);
        return(NULL);
    }

    /*
     * read the value
     */
    SKIP_BLANKS;
    if (CUR == '=') {
        NEXT;
	SKIP_BLANKS;
	val = htmlParseAttValue(ctxt);
    }

    *value = val;
    return(name);
}